

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O1

int number_of_parameter_constraints_in(CgreenVector *constraints)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  Constraint *constraint;
  int position;
  
  iVar2 = cgreen_vector_size(constraints);
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  else {
    position = 0;
    iVar2 = 0;
    do {
      constraint = (Constraint *)cgreen_vector_get(constraints,position);
      _Var1 = is_comparing(constraint);
      iVar2 = iVar2 + (uint)_Var1;
      position = position + 1;
      iVar3 = cgreen_vector_size(constraints);
    } while (position < iVar3);
  }
  return iVar2;
}

Assistant:

int number_of_parameter_constraints_in(const CgreenVector* constraints) {
    int i, parameters = 0;

    for (i = 0; i < cgreen_vector_size(constraints); i++) {
        Constraint *constraint = (Constraint *)cgreen_vector_get(constraints, i);

        if (is_comparing(constraint)) {
           parameters++;
        }
    }

    return parameters;
}